

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QRhiGles2::endPass(QRhiGles2 *this,QRhiCommandBuffer *cb,QRhiResourceUpdateBatch *resourceUpdates)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  QRhiColorAttachment *pQVar12;
  QRhiTexture *pQVar13;
  QRhiRenderBuffer *pQVar14;
  Command *pCVar15;
  QRhiTexture *pQVar16;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Command *cmd_4;
  bool mayDiscardDepthStencil;
  Command *cmd_3;
  int resolveIdx_1;
  int resolveCount_1;
  QGles2Texture *depthTexD;
  Command *cmd_2;
  QGles2RenderBuffer *rbD_1;
  QGles2Texture *depthResolveTexD;
  Command *cmd_1;
  int dstLayer;
  int srcLayer;
  int resolveIdx;
  int resolveCount;
  QGles2Texture *texD;
  bool hasZ;
  Command *cmd;
  QGles2RenderBuffer *rbD;
  QGles2Texture *resolveTexD;
  QRhiColorAttachment *colorAtt;
  QRhiColorAttachment *itEnd;
  QRhiColorAttachment *it;
  QGles2TextureRenderTarget *rtTex;
  QGles2CommandBuffer *cbD;
  QSize size_1;
  QSize size;
  undefined4 in_stack_fffffffffffffe78;
  Flag in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  int local_164;
  bool local_15d;
  int local_130;
  int local_f8;
  QRhiColorAttachment *local_b8;
  char local_70 [32];
  QSize in_stack_ffffffffffffffb0;
  QSize in_stack_ffffffffffffffb8;
  QSize in_stack_ffffffffffffffc0;
  char local_38 [32];
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (**(code **)(**(long **)(in_RSI + 0xf0) + 0x10))();
  if (iVar4 != 6) goto LAB_00928a10;
  lVar1 = *(long *)(in_RSI + 0xf0);
  local_b8 = QRhiTextureRenderTargetDescription::cbeginColorAttachments
                       ((QRhiTextureRenderTargetDescription *)0x927ef7);
  pQVar12 = QRhiTextureRenderTargetDescription::cendColorAttachments
                      ((QRhiTextureRenderTargetDescription *)0x927f10);
  for (; local_b8 != pQVar12; local_b8 = local_b8 + 1) {
    pQVar13 = QRhiColorAttachment::resolveTexture(local_b8);
    if (pQVar13 != (QRhiTexture *)0x0) {
      pQVar13 = QRhiColorAttachment::resolveTexture(local_b8);
      local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = QRhiTexture::pixelSize
                           ((QRhiTexture *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      pQVar14 = QRhiColorAttachment::renderBuffer(local_b8);
      if (pQVar14 == (QRhiRenderBuffer *)0x0) {
        if ((*(ushort *)(in_RDI + 0x250) >> 8 & 1) == 0) {
          pQVar16 = QRhiColorAttachment::texture(local_b8);
          in_stack_ffffffffffffffb0 =
               QRhiTexture::pixelSize
                         ((QRhiTexture *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          bVar2 = ::operator!=((QSize *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                ),
                               (QSize *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ));
          if (bVar2) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       in_stack_fffffffffffffe84,
                       (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            QRhiTexture::pixelSize
                      ((QRhiTexture *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80))
            ;
            in_stack_fffffffffffffe90 = QSize::width((QSize *)0x9282fe);
            QRhiTexture::pixelSize
                      ((QRhiTexture *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80))
            ;
            in_stack_fffffffffffffe94 = QSize::height((QSize *)0x928324);
            uVar5 = QSize::width((QSize *)0x928335);
            uVar6 = QSize::height((QSize *)0x928346);
            QMessageLogger::warning
                      (local_70,"Resolve source (%dx%d) and target (%dx%d) size does not match",
                       (ulong)in_stack_fffffffffffffe90,(ulong)in_stack_fffffffffffffe94,
                       (ulong)uVar5,(ulong)uVar6);
          }
          iVar4 = QRhiColorAttachment::multiViewCount(local_b8);
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          else {
            iVar4 = QRhiColorAttachment::multiViewCount(local_b8);
          }
          in_stack_fffffffffffffe8c = iVar4;
          for (local_f8 = 0; local_f8 < iVar4; local_f8 = local_f8 + 1) {
            iVar9 = QRhiColorAttachment::layer(local_b8);
            iVar10 = QRhiColorAttachment::resolveLayer(local_b8);
            pCVar15 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                                ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
            pCVar15->cmd = BlitFromTexture;
            bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                              ((QFlags<QRhiTexture::Flag> *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe7c);
            if (bVar2) {
              (pCVar15->args).scissor.x = iVar9 + local_f8 + 0x8515;
            }
            else {
              (pCVar15->args).beginFrame.timestampQuery =
                   *(GLuint *)((long)&pQVar16[1].super_QRhiResource._vptr_QRhiResource + 4);
            }
            (pCVar15->args).viewport.y = *(float *)&pQVar16->field_0x64;
            iVar11 = QRhiColorAttachment::level(local_b8);
            (pCVar15->args).scissor.w = iVar11;
            (pCVar15->args).viewport.h = 0.0;
            bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                              ((QFlags<QRhiTexture::Flag> *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe7c);
            if ((bVar2) ||
               (bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                                  ((QFlags<QRhiTexture::Flag> *)
                                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                   in_stack_fffffffffffffe7c), bVar2)) {
              (pCVar15->args).scissor.h = iVar9 + local_f8;
            }
            iVar9 = QSize::width((QSize *)0x928515);
            (pCVar15->args).bindVertexBuffer.binding = iVar9;
            iVar9 = QSize::height((QSize *)0x92852f);
            (pCVar15->args).getBufferSubData.size = iVar9;
            bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                              ((QFlags<QRhiTexture::Flag> *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe7c);
            if (bVar2) {
              (pCVar15->args).drawIndexed.baseVertex = iVar10 + local_f8 + 0x8515;
            }
            else {
              (pCVar15->args).drawIndexed.baseVertex =
                   *(qint32 *)((long)&pQVar13[1].super_QRhiResource._vptr_QRhiResource + 4);
            }
            (pCVar15->args).bindShaderResources.dynamicOffsetPairs[0] =
                 *(uint *)&pQVar13->field_0x64;
            iVar9 = QRhiColorAttachment::resolveLevel(local_b8);
            (pCVar15->args).subImage.h = iVar9;
            (pCVar15->args).bindShaderResources.dynamicOffsetPairs[2] = 0;
            bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                              ((QFlags<QRhiTexture::Flag> *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe7c);
            if ((bVar2) ||
               (bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                                  ((QFlags<QRhiTexture::Flag> *)
                                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                   in_stack_fffffffffffffe7c), bVar2)) {
              (pCVar15->args).bindShaderResources.dynamicOffsetPairs[2] = iVar10 + local_f8;
            }
            (pCVar15->args).blitFromTexture.isDepthStencil = false;
          }
        }
      }
      else {
        pQVar14 = QRhiColorAttachment::renderBuffer(local_b8);
        local_18 = QRhiRenderBuffer::pixelSize
                             ((QRhiRenderBuffer *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        bVar2 = ::operator!=((QSize *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             (QSize *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
        if (bVar2) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                     ,(char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     in_stack_fffffffffffffe84,
                     (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          in_stack_ffffffffffffffc0 =
               QRhiRenderBuffer::pixelSize
                         ((QRhiRenderBuffer *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          uVar5 = QSize::width((QSize *)0x928038);
          in_stack_ffffffffffffffb8 =
               QRhiRenderBuffer::pixelSize
                         ((QRhiRenderBuffer *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          uVar6 = QSize::height((QSize *)0x92805e);
          uVar7 = QSize::width((QSize *)0x92806f);
          uVar8 = QSize::height((QSize *)0x928080);
          QMessageLogger::warning
                    (local_38,"Resolve source (%dx%d) and target (%dx%d) size does not match",
                     (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
        }
        if ((*(ushort *)(in_RDI + 0x250) >> 8 & 1) == 0) {
          pCVar15 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                              ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          pCVar15->cmd = BlitFromRenderbuffer;
          (pCVar15->args).beginFrame.timestampQuery =
               *(GLuint *)&pQVar14[1].super_QRhiResource._vptr_QRhiResource;
          iVar4 = QSize::width((QSize *)0x928123);
          (pCVar15->args).scissor.y = iVar4;
          iVar4 = QSize::height((QSize *)0x92813d);
          (pCVar15->args).scissor.w = iVar4;
          bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                            ((QFlags<QRhiTexture::Flag> *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             in_stack_fffffffffffffe7c);
          if (bVar2) {
            iVar4 = QRhiColorAttachment::resolveLayer(local_b8);
            (pCVar15->args).scissor.h = iVar4 + 0x8515;
          }
          else {
            (pCVar15->args).viewport.h =
                 *(float *)((long)&pQVar13[1].super_QRhiResource._vptr_QRhiResource + 4);
          }
          (pCVar15->args).viewport.d0 = *(float *)&pQVar13->field_0x64;
          iVar4 = QRhiColorAttachment::resolveLevel(local_b8);
          (pCVar15->args).getBufferSubData.size = iVar4;
          bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                            ((QFlags<QRhiTexture::Flag> *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             in_stack_fffffffffffffe7c);
          local_15d = true;
          if (!bVar2) {
            local_15d = QFlags<QRhiTexture::Flag>::testFlag
                                  ((QFlags<QRhiTexture::Flag> *)
                                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                   in_stack_fffffffffffffe7c);
          }
          if (local_15d == false) {
            local_164 = 0;
          }
          else {
            local_164 = QRhiColorAttachment::resolveLayer(local_b8);
          }
          (pCVar15->args).bindShaderResources.dynamicOffsetCount = local_164;
          (pCVar15->args).blitFromRenderbuffer.isDepthStencil = false;
        }
      }
    }
  }
  pQVar13 = QRhiTextureRenderTargetDescription::depthResolveTexture
                      ((QRhiTextureRenderTargetDescription *)(lVar1 + 0x38));
  if (pQVar13 != (QRhiTexture *)0x0) {
    pQVar13 = QRhiTextureRenderTargetDescription::depthResolveTexture
                        ((QRhiTextureRenderTargetDescription *)(lVar1 + 0x38));
    QRhiTexture::pixelSize
              ((QRhiTexture *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    pQVar14 = QRhiTextureRenderTargetDescription::depthStencilBuffer
                        ((QRhiTextureRenderTargetDescription *)(lVar1 + 0x38));
    if (pQVar14 == (QRhiRenderBuffer *)0x0) {
      if ((*(ushort *)(in_RDI + 0x250) >> 8 & 1) == 0) {
        pQVar16 = QRhiTextureRenderTargetDescription::depthTexture
                            ((QRhiTextureRenderTargetDescription *)(lVar1 + 0x38));
        iVar4 = QRhiTexture::arraySize(pQVar16);
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        else {
          iVar4 = QRhiTexture::arraySize(pQVar16);
        }
        for (local_130 = 0; local_130 < iVar4; local_130 = local_130 + 1) {
          pCVar15 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                              ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          pCVar15->cmd = BlitFromTexture;
          (pCVar15->args).beginFrame.timestampQuery =
               *(GLuint *)((long)&pQVar16[1].super_QRhiResource._vptr_QRhiResource + 4);
          (pCVar15->args).viewport.y = *(float *)&pQVar16->field_0x64;
          (pCVar15->args).viewport.w = 0.0;
          (pCVar15->args).scissor.h = local_130;
          iVar9 = QSize::width((QSize *)0x92887b);
          (pCVar15->args).bindVertexBuffer.binding = iVar9;
          iVar9 = QSize::height((QSize *)0x928892);
          (pCVar15->args).getBufferSubData.size = iVar9;
          (pCVar15->args).drawIndexed.baseVertex =
               *(qint32 *)((long)&pQVar13[1].super_QRhiResource._vptr_QRhiResource + 4);
          (pCVar15->args).bindShaderResources.dynamicOffsetPairs[0] = *(uint *)&pQVar13->field_0x64;
          (pCVar15->args).bindShaderResources.dynamicOffsetPairs[1] = 0;
          (pCVar15->args).readPixels.level = local_130;
          (pCVar15->args).blitFromTexture.isDepthStencil = true;
        }
      }
    }
    else {
      pQVar14 = QRhiTextureRenderTargetDescription::depthStencilBuffer
                          ((QRhiTextureRenderTargetDescription *)(lVar1 + 0x38));
      pCVar15 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                          ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      pCVar15->cmd = BlitFromRenderbuffer;
      (pCVar15->args).beginFrame.timestampQuery =
           *(GLuint *)&pQVar14[1].super_QRhiResource._vptr_QRhiResource;
      iVar4 = QSize::width((QSize *)0x928720);
      (pCVar15->args).scissor.y = iVar4;
      iVar4 = QSize::height((QSize *)0x928737);
      (pCVar15->args).scissor.w = iVar4;
      (pCVar15->args).viewport.h =
           *(float *)((long)&pQVar13[1].super_QRhiResource._vptr_QRhiResource + 4);
      (pCVar15->args).viewport.d0 = *(float *)&pQVar13->field_0x64;
      (pCVar15->args).viewport.d1 = 0.0;
      (pCVar15->args).drawIndexed.baseVertex = 0;
      (pCVar15->args).blitFromRenderbuffer.isDepthStencil = true;
    }
  }
  pQVar14 = QRhiTextureRenderTargetDescription::depthStencilBuffer
                      ((QRhiTextureRenderTargetDescription *)(lVar1 + 0x38));
  if (pQVar14 == (QRhiRenderBuffer *)0x0) {
    pQVar13 = QRhiTextureRenderTargetDescription::depthTexture
                        ((QRhiTextureRenderTargetDescription *)(lVar1 + 0x38));
    bVar2 = false;
    if (pQVar13 != (QRhiTexture *)0x0) {
      bVar3 = QFlags<QRhiTextureRenderTarget::Flag>::testFlag
                        ((QFlags<QRhiTextureRenderTarget::Flag> *)
                         (CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80) &
                         0xffffffffffffff),in_stack_fffffffffffffe7c);
      bVar2 = false;
      if (bVar3) goto LAB_00928952;
    }
  }
  else {
LAB_00928952:
    pQVar13 = QRhiTextureRenderTargetDescription::depthResolveTexture
                        ((QRhiTextureRenderTargetDescription *)(lVar1 + 0x38));
    bVar2 = pQVar13 == (QRhiTexture *)0x0;
  }
  if (bVar2) {
    pCVar15 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                        ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    pCVar15->cmd = InvalidateFramebuffer;
    if ((*(uint *)(in_RDI + 0x24c) >> 0xe & 1) == 0) {
      (pCVar15->args).viewport.x = 2.8026e-45;
      (pCVar15->args).viewport.y = 5.05813e-41;
      (pCVar15->args).viewport.w = 5.06261e-41;
    }
    else {
      (pCVar15->args).viewport.x = 1.4013e-45;
      (pCVar15->args).viewport.y = 4.66716e-41;
    }
  }
LAB_00928a10:
  *(undefined4 *)(in_RSI + 0xdc) = 0;
  *(undefined8 *)(in_RSI + 0xf0) = 0;
  if (in_RDX != 0) {
    enqueueResourceUpdates
              ((QRhiGles2 *)in_stack_ffffffffffffffc0,(QRhiCommandBuffer *)in_stack_ffffffffffffffb8
               ,(QRhiResourceUpdateBatch *)in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::endPass(QRhiCommandBuffer *cb, QRhiResourceUpdateBatch *resourceUpdates)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::RenderPass);

    if (cbD->currentTarget->resourceType() == QRhiResource::TextureRenderTarget) {
        QGles2TextureRenderTarget *rtTex = QRHI_RES(QGles2TextureRenderTarget, cbD->currentTarget);
        for (auto it = rtTex->m_desc.cbeginColorAttachments(), itEnd = rtTex->m_desc.cendColorAttachments();
             it != itEnd; ++it)
        {
            const QRhiColorAttachment &colorAtt(*it);
            if (!colorAtt.resolveTexture())
                continue;

            QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
            const QSize size = resolveTexD->pixelSize();
            if (colorAtt.renderBuffer()) {
                QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, colorAtt.renderBuffer());
                if (rbD->pixelSize() != size) {
                    qWarning("Resolve source (%dx%d) and target (%dx%d) size does not match",
                             rbD->pixelSize().width(), rbD->pixelSize().height(), size.width(), size.height());
                }
                if (caps.glesMultisampleRenderToTexture) {
                    // colorAtt.renderBuffer() is not actually used for anything if OpenGL ES'
                    // auto-resolving GL_EXT_multisampled_render_to_texture is used.
                } else {
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromRenderbuffer;
                    cmd.args.blitFromRenderbuffer.renderbuffer = rbD->renderbuffer;
                    cmd.args.blitFromRenderbuffer.w = size.width();
                    cmd.args.blitFromRenderbuffer.h = size.height();
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromRenderbuffer.target = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(colorAtt.resolveLayer());
                    else
                        cmd.args.blitFromRenderbuffer.target = resolveTexD->target;
                    cmd.args.blitFromRenderbuffer.dstTexture = resolveTexD->texture;
                    cmd.args.blitFromRenderbuffer.dstLevel = colorAtt.resolveLevel();
                    const bool hasZ = resolveTexD->m_flags.testFlag(QRhiTexture::ThreeDimensional)
                        || resolveTexD->m_flags.testFlag(QRhiTexture::TextureArray);
                    cmd.args.blitFromRenderbuffer.dstLayer = hasZ ? colorAtt.resolveLayer() : 0;
                    cmd.args.blitFromRenderbuffer.isDepthStencil = false;
                }
            } else if (caps.glesMultisampleRenderToTexture) {
                // Nothing to do, resolving into colorAtt.resolveTexture() is automatic,
                // colorAtt.texture() is in fact not used for anything.
            } else {
                Q_ASSERT(colorAtt.texture());
                QGles2Texture *texD = QRHI_RES(QGles2Texture, colorAtt.texture());
                if (texD->pixelSize() != size) {
                    qWarning("Resolve source (%dx%d) and target (%dx%d) size does not match",
                             texD->pixelSize().width(), texD->pixelSize().height(), size.width(), size.height());
                }
                const int resolveCount = colorAtt.multiViewCount() >= 2 ? colorAtt.multiViewCount() : 1;
                for (int resolveIdx = 0; resolveIdx < resolveCount; ++resolveIdx) {
                    const int srcLayer = colorAtt.layer() + resolveIdx;
                    const int dstLayer = colorAtt.resolveLayer() + resolveIdx;
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromTexture;
                    if (texD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromTexture.srcTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(srcLayer);
                    else
                        cmd.args.blitFromTexture.srcTarget = texD->target;
                    cmd.args.blitFromTexture.srcTexture = texD->texture;
                    cmd.args.blitFromTexture.srcLevel = colorAtt.level();
                    cmd.args.blitFromTexture.srcLayer = 0;
                    if (texD->m_flags.testFlag(QRhiTexture::ThreeDimensional) || texD->m_flags.testFlag(QRhiTexture::TextureArray))
                        cmd.args.blitFromTexture.srcLayer = srcLayer;
                    cmd.args.blitFromTexture.w = size.width();
                    cmd.args.blitFromTexture.h = size.height();
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromTexture.dstTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(dstLayer);
                    else
                        cmd.args.blitFromTexture.dstTarget = resolveTexD->target;
                    cmd.args.blitFromTexture.dstTexture = resolveTexD->texture;
                    cmd.args.blitFromTexture.dstLevel = colorAtt.resolveLevel();
                    cmd.args.blitFromTexture.dstLayer = 0;
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::ThreeDimensional) || resolveTexD->m_flags.testFlag(QRhiTexture::TextureArray))
                        cmd.args.blitFromTexture.dstLayer = dstLayer;
                    cmd.args.blitFromTexture.isDepthStencil = false;
                }
            }
        }

        if (rtTex->m_desc.depthResolveTexture()) {
            QGles2Texture *depthResolveTexD = QRHI_RES(QGles2Texture, rtTex->m_desc.depthResolveTexture());
            const QSize size = depthResolveTexD->pixelSize();
            if (rtTex->m_desc.depthStencilBuffer()) {
                QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, rtTex->m_desc.depthStencilBuffer());
                QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                cmd.cmd = QGles2CommandBuffer::Command::BlitFromRenderbuffer;
                cmd.args.blitFromRenderbuffer.renderbuffer = rbD->renderbuffer;
                cmd.args.blitFromRenderbuffer.w = size.width();
                cmd.args.blitFromRenderbuffer.h = size.height();
                cmd.args.blitFromRenderbuffer.target = depthResolveTexD->target;
                cmd.args.blitFromRenderbuffer.dstTexture = depthResolveTexD->texture;
                cmd.args.blitFromRenderbuffer.dstLevel = 0;
                cmd.args.blitFromRenderbuffer.dstLayer = 0;
                cmd.args.blitFromRenderbuffer.isDepthStencil = true;
            } else if (caps.glesMultisampleRenderToTexture) {
                // Nothing to do, resolving into depthResolveTexture() is automatic.
            } else {
                QGles2Texture *depthTexD = QRHI_RES(QGles2Texture, rtTex->m_desc.depthTexture());
                const int resolveCount = depthTexD->arraySize() >= 2 ? depthTexD->arraySize() : 1;
                for (int resolveIdx = 0; resolveIdx < resolveCount; ++resolveIdx) {
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromTexture;
                    cmd.args.blitFromTexture.srcTarget = depthTexD->target;
                    cmd.args.blitFromTexture.srcTexture = depthTexD->texture;
                    cmd.args.blitFromTexture.srcLevel = 0;
                    cmd.args.blitFromTexture.srcLayer = resolveIdx;
                    cmd.args.blitFromTexture.w = size.width();
                    cmd.args.blitFromTexture.h = size.height();
                    cmd.args.blitFromTexture.dstTarget = depthResolveTexD->target;
                    cmd.args.blitFromTexture.dstTexture = depthResolveTexD->texture;
                    cmd.args.blitFromTexture.dstLevel = 0;
                    cmd.args.blitFromTexture.dstLayer = resolveIdx;
                    cmd.args.blitFromTexture.isDepthStencil = true;
                }
            }
        }

        const bool mayDiscardDepthStencil =
            (rtTex->m_desc.depthStencilBuffer()
             || (rtTex->m_desc.depthTexture() && rtTex->m_flags.testFlag(QRhiTextureRenderTarget::DoNotStoreDepthStencilContents)))
            && !rtTex->m_desc.depthResolveTexture();
        if (mayDiscardDepthStencil) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::InvalidateFramebuffer;
            if (caps.needsDepthStencilCombinedAttach) {
                cmd.args.invalidateFramebuffer.attCount = 1;
                cmd.args.invalidateFramebuffer.att[0] = GL_DEPTH_STENCIL_ATTACHMENT;
            } else {
                cmd.args.invalidateFramebuffer.attCount = 2;
                cmd.args.invalidateFramebuffer.att[0] = GL_DEPTH_ATTACHMENT;
                cmd.args.invalidateFramebuffer.att[1] = GL_STENCIL_ATTACHMENT;
            }
        }
    }

    cbD->recordingPass = QGles2CommandBuffer::NoPass;
    cbD->currentTarget = nullptr;

    if (resourceUpdates)
        enqueueResourceUpdates(cb, resourceUpdates);
}